

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

int __thiscall yy::parser::parse(parser *this)

{
  char cVar1;
  ReferenceType RVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  ParserCtx *pPVar5;
  bool bVar6;
  symbol_kind_type sVar7;
  int yyvalue;
  int iVar8;
  ostream *poVar9;
  stack_symbol_type *psVar10;
  ReferenceType *pRVar11;
  unsigned_long *puVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  index_type iVar14;
  basic_symbol<yy::parser::by_state> *pbVar15;
  counter_type *local_658;
  stack_symbol_type *local_3a0;
  undefined1 local_398 [8];
  stack_symbol_type error_token;
  string local_330 [8];
  string msg;
  context yyctx;
  syntax_error *yyexc_1;
  string local_2f0 [32];
  int local_2d0 [2];
  unsigned_long local_2c8;
  allocator<char> local_2b9;
  string local_2b8 [32];
  undefined1 local_298 [8];
  slice range;
  stack_symbol_type yylhs;
  syntax_error *yyexc;
  symbol_type yylookahead;
  int yyresult;
  undefined1 local_1a8 [8];
  stack_symbol_type yyerror_range [3];
  symbol_type yyla;
  int yyerrstatus_;
  int yynerrs_;
  int yylen;
  int yyn;
  parser *this_local;
  
  yyerrstatus_ = 0;
  yyla.super_basic_symbol<yy::parser::by_kind>.location.end.column = 0;
  yyla.super_basic_symbol<yy::parser::by_kind>.location.end.line = 0;
  symbol_type::symbol_type
            ((symbol_type *)
             &yyerror_range[2].super_basic_symbol<yy::parser::by_state>.location.end.line);
  local_3a0 = (stack_symbol_type *)local_1a8;
  do {
    stack_symbol_type::stack_symbol_type(local_3a0);
    local_3a0 = local_3a0 + 1;
  } while (local_3a0 !=
           (stack_symbol_type *)
           &yyerror_range[2].super_basic_symbol<yy::parser::by_state>.location.end.line);
  yy_lac_discard_(this,"init");
  if (this->yydebug_ != 0) {
    std::operator<<(this->yycdebug_,"Starting parse\n");
  }
  stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
  ::clear(&this->yystack_);
  yypush_(this,(char *)0x0,'\0',
          (symbol_type *)
          &yyerror_range[2].super_basic_symbol<yy::parser::by_state>.location.end.line);
LAB_0010828b:
  if (this->yydebug_ != 0) {
    poVar9 = std::operator<<(this->yycdebug_,"Entering state ");
    psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
              ::operator[](&this->yystack_,0);
    poVar9 = (ostream *)
             std::ostream::operator<<
                       (poVar9,(int)(psVar10->super_basic_symbol<yy::parser::by_state>).
                                    super_by_state.state);
    std::operator<<(poVar9,'\n');
  }
  if (this->yydebug_ != 0) {
    (*this->_vptr_parser[6])();
  }
  psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
            ::operator[](&this->yystack_,0);
  if ((psVar10->super_basic_symbol<yy::parser::by_state>).super_by_state.state == '\x03') {
    yylookahead.super_basic_symbol<yy::parser::by_kind>.location.end.line = 0;
    goto LAB_00109c27;
  }
  psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
            ::operator[](&this->yystack_,0);
  cVar1 = yypact_[(int)(psVar10->super_basic_symbol<yy::parser::by_state>).super_by_state.state];
  bVar6 = yy_pact_value_is_default_((int)cVar1);
  if (bVar6) {
LAB_001086fe:
    psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
              ::operator[](&this->yystack_,0);
    yynerrs_ = (int)(char)yydefact_[(int)(psVar10->super_basic_symbol<yy::parser::by_state>).
                                         super_by_state.state];
    if (yynerrs_ == 0) goto LAB_00109849;
LAB_00108743:
    yyerrstatus_ = (int)(char)yyr2_[yynerrs_];
    stack_symbol_type::stack_symbol_type((stack_symbol_type *)&range.range_);
    psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
              ::operator[](&this->yystack_,(long)yyerrstatus_);
    range.range_._0_1_ =
         yy_lr_goto_state_((psVar10->super_basic_symbol<yy::parser::by_state>).super_by_state.state,
                           (int)(char)yyr1_[yynerrs_]);
    iVar8 = (int)(char)yyr1_[yynerrs_];
    if ((iVar8 == 7) || (iVar8 == 0xb)) {
LAB_0010886d:
      value_type::emplace<std::__cxx11::string>
                ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8);
    }
    else if (iVar8 == 0xe) {
      value_type::emplace<ReferenceType>
                ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8);
    }
    else {
      if (iVar8 - 0x10U < 3) goto LAB_0010886d;
      if (((iVar8 - 0x1eU < 3) || (iVar8 - 0x25U < 2)) || ((iVar8 == 0x28 || (iVar8 - 0x2aU < 2))))
      {
        value_type::emplace<unsigned_long>
                  ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8);
      }
    }
    stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
    ::slice::slice((slice *)local_298,&this->yystack_,(long)yyerrstatus_);
    if (yyerrstatus_ == 0) {
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::slice::operator[]((slice *)local_298,0);
      yylhs.super_basic_symbol<yy::parser::by_state>.value._40_8_ =
           (psVar10->super_basic_symbol<yy::parser::by_state>).location.end.filename;
      yylhs.super_basic_symbol<yy::parser::by_state>.location.begin.filename =
           *(filename_type **)&(psVar10->super_basic_symbol<yy::parser::by_state>).location.end.line
      ;
      yylhs.super_basic_symbol<yy::parser::by_state>.location.begin._8_8_ =
           yylhs.super_basic_symbol<yy::parser::by_state>.value._40_8_;
      yylhs.super_basic_symbol<yy::parser::by_state>.location.end.filename =
           yylhs.super_basic_symbol<yy::parser::by_state>.location.begin.filename;
    }
    else {
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::slice::operator[]((slice *)local_298,1);
      yylhs.super_basic_symbol<yy::parser::by_state>.value._40_8_ =
           (psVar10->super_basic_symbol<yy::parser::by_state>).location.begin.filename;
      yylhs.super_basic_symbol<yy::parser::by_state>.location.begin.filename =
           *(filename_type **)
            &(psVar10->super_basic_symbol<yy::parser::by_state>).location.begin.line;
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::slice::operator[]((slice *)local_298,(long)yyerrstatus_);
      yylhs.super_basic_symbol<yy::parser::by_state>.location.begin._8_8_ =
           (psVar10->super_basic_symbol<yy::parser::by_state>).location.end.filename;
      yylhs.super_basic_symbol<yy::parser::by_state>.location.end.filename =
           *(filename_type **)&(psVar10->super_basic_symbol<yy::parser::by_state>).location.end.line
      ;
    }
    yyerror_range[1].super_basic_symbol<yy::parser::by_state>.value._40_8_ =
         yylhs.super_basic_symbol<yy::parser::by_state>.value._40_8_;
    yyerror_range[1].super_basic_symbol<yy::parser::by_state>.location.begin.filename =
         yylhs.super_basic_symbol<yy::parser::by_state>.location.begin.filename;
    yyerror_range[1].super_basic_symbol<yy::parser::by_state>.location.begin.line =
         yylhs.super_basic_symbol<yy::parser::by_state>.location.begin.line;
    yyerror_range[1].super_basic_symbol<yy::parser::by_state>.location.begin.column =
         yylhs.super_basic_symbol<yy::parser::by_state>.location.begin.column;
    yyerror_range[1].super_basic_symbol<yy::parser::by_state>.location.end.filename =
         yylhs.super_basic_symbol<yy::parser::by_state>.location.end.filename;
    if (this->yydebug_ != 0) {
      (*this->_vptr_parser[5])(this,(ulong)(uint)yynerrs_);
    }
    switch(yynerrs_) {
    case 2:
      PushState(1,this->yyscanner);
      break;
    case 3:
      PopState(this->yyscanner);
      break;
    default:
      break;
    case 6:
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::operator[](&this->yystack_,0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_2b8,"only UTF-8 BOM is supported",&local_2b9);
      (*this->_vptr_parser[3])
                (this,&(psVar10->super_basic_symbol<yy::parser::by_state>).location,local_2b8);
      std::__cxx11::string::~string(local_2b8);
      std::allocator<char>::~allocator(&local_2b9);
      yylhs.super_basic_symbol<yy::parser::by_state>.location.end.column = 0x13;
      goto LAB_00109801;
    case 9:
      if ((this->ctx->immediateEval & 1U) == 0) {
        std::vector<rpn::RPNExpression,_std::allocator<rpn::RPNExpression>_>::push_back
                  (&this->ctx->rpnExprList,&this->ctx->rpnExpr);
      }
      else {
        rpn::RPNExpression::Evaluate(&this->ctx->rpnExpr);
        std::operator<<((ostream *)&std::cout,'\n');
      }
      rpn::RPNExpression::Clear(&this->ctx->rpnExpr);
      break;
    case 0xf:
      pPVar5 = this->ctx;
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::operator[](&this->yystack_,0);
      pbVar13 = value_type::as<std::__cxx11::string>
                          (&(psVar10->super_basic_symbol<yy::parser::by_state>).value);
      rpn::RPNExpression::Push<rpn::StringExpression,std::__cxx11::string>(&pPVar5->rpnExpr,pbVar13)
      ;
      break;
    case 0x10:
      PushState(3,this->yyscanner);
      break;
    case 0x11:
      pPVar5 = this->ctx;
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::operator[](&this->yystack_,1);
      puVar12 = value_type::as<unsigned_long>
                          (&(psVar10->super_basic_symbol<yy::parser::by_state>).value);
      local_2c8 = *puVar12 + 1;
      rpn::RPNExpression::Push<rpn::CommandCallExpression,unsigned_long>
                (&pPVar5->rpnExpr,&local_2c8);
      PopState(this->yyscanner);
      break;
    case 0x12:
      puVar12 = value_type::as<unsigned_long>
                          ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8);
      *puVar12 = 0;
      break;
    case 0x13:
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::operator[](&this->yystack_,1);
      puVar12 = value_type::as<unsigned_long>
                          (&(psVar10->super_basic_symbol<yy::parser::by_state>).value);
      uVar4 = *puVar12;
      puVar12 = value_type::as<unsigned_long>
                          ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8);
      *puVar12 = uVar4;
      break;
    case 0x14:
      puVar12 = value_type::as<unsigned_long>
                          ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8);
      *puVar12 = 1;
      break;
    case 0x15:
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::operator[](&this->yystack_,0);
      puVar12 = value_type::as<unsigned_long>
                          (&(psVar10->super_basic_symbol<yy::parser::by_state>).value);
      uVar4 = *puVar12;
      puVar12 = value_type::as<unsigned_long>
                          ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8);
      *puVar12 = uVar4;
      break;
    case 0x16:
      puVar12 = value_type::as<unsigned_long>
                          ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8);
      *puVar12 = 0;
      break;
    case 0x17:
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::operator[](&this->yystack_,2);
      puVar12 = value_type::as<unsigned_long>
                          (&(psVar10->super_basic_symbol<yy::parser::by_state>).value);
      uVar4 = *puVar12;
      puVar12 = value_type::as<unsigned_long>
                          ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8);
      *puVar12 = uVar4 + 1;
      break;
    case 0x18:
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::operator[](&this->yystack_,2);
      puVar12 = value_type::as<unsigned_long>
                          (&(psVar10->super_basic_symbol<yy::parser::by_state>).value);
      uVar4 = *puVar12;
      puVar12 = value_type::as<unsigned_long>
                          ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8);
      *puVar12 = uVar4;
      break;
    case 0x19:
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::operator[](&this->yystack_,2);
      puVar12 = value_type::as<unsigned_long>
                          (&(psVar10->super_basic_symbol<yy::parser::by_state>).value);
      uVar4 = *puVar12;
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::operator[](&this->yystack_,0);
      puVar12 = value_type::as<unsigned_long>
                          (&(psVar10->super_basic_symbol<yy::parser::by_state>).value);
      uVar3 = *puVar12;
      puVar12 = value_type::as<unsigned_long>
                          ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8);
      *puVar12 = uVar4 + uVar3;
      break;
    case 0x1a:
      rpn::RPNExpression::Push<rpn::StringExpression,char_const(&)[2]>
                (&this->ctx->rpnExpr,(char (*) [2])0x11df21);
      local_2d0[1] = 1;
      rpn::RPNExpression::Push<rpn::UnquotedArgExpression,int>(&this->ctx->rpnExpr,local_2d0 + 1);
      break;
    case 0x1b:
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::operator[](&this->yystack_,1);
      puVar12 = value_type::as<unsigned_long>
                          (&(psVar10->super_basic_symbol<yy::parser::by_state>).value);
      uVar4 = *puVar12;
      puVar12 = value_type::as<unsigned_long>
                          ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8);
      *puVar12 = uVar4 + 2;
      rpn::RPNExpression::Push<rpn::StringExpression,char_const(&)[2]>
                (&this->ctx->rpnExpr,(char (*) [2])0x11d3dc);
      local_2d0[0] = 1;
      rpn::RPNExpression::Push<rpn::UnquotedArgExpression,int>(&this->ctx->rpnExpr,local_2d0);
      break;
    case 0x20:
      pPVar5 = this->ctx;
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::operator[](&this->yystack_,0);
      pbVar13 = value_type::as<std::__cxx11::string>
                          (&(psVar10->super_basic_symbol<yy::parser::by_state>).value);
      rpn::RPNExpression::Push<rpn::StringExpression,std::__cxx11::string>(&pPVar5->rpnExpr,pbVar13)
      ;
      rpn::RPNExpression::Push<rpn::BracketArgExpression>(&this->ctx->rpnExpr);
      break;
    case 0x21:
      pPVar5 = this->ctx;
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::operator[](&this->yystack_,0);
      puVar12 = value_type::as<unsigned_long>
                          (&(psVar10->super_basic_symbol<yy::parser::by_state>).value);
      rpn::RPNExpression::Push<rpn::QuotedArgExpression,unsigned_long&>(&pPVar5->rpnExpr,puVar12);
      break;
    case 0x22:
      pPVar5 = this->ctx;
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::operator[](&this->yystack_,0);
      puVar12 = value_type::as<unsigned_long>
                          (&(psVar10->super_basic_symbol<yy::parser::by_state>).value);
      rpn::RPNExpression::Push<rpn::UnquotedArgExpression,unsigned_long&>(&pPVar5->rpnExpr,puVar12);
      break;
    case 0x23:
      puVar12 = value_type::as<unsigned_long>
                          ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8);
      *puVar12 = 1;
      rpn::RPNExpression::Push<rpn::StringExpression,char_const(&)[1]>
                (&this->ctx->rpnExpr,(char (*) [1])0x11d01e);
      break;
    case 0x24:
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::operator[](&this->yystack_,1);
      puVar12 = value_type::as<unsigned_long>
                          (&(psVar10->super_basic_symbol<yy::parser::by_state>).value);
      uVar4 = *puVar12;
      puVar12 = value_type::as<unsigned_long>
                          ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8);
      *puVar12 = uVar4;
      break;
    case 0x25:
      puVar12 = value_type::as<unsigned_long>
                          ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8);
      *puVar12 = 1;
      break;
    case 0x26:
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::operator[](&this->yystack_,1);
      puVar12 = value_type::as<unsigned_long>
                          (&(psVar10->super_basic_symbol<yy::parser::by_state>).value);
      uVar4 = *puVar12;
      puVar12 = value_type::as<unsigned_long>
                          ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8);
      *puVar12 = uVar4 + 1;
      break;
    case 0x27:
      pPVar5 = this->ctx;
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::operator[](&this->yystack_,0);
      pbVar13 = value_type::as<std::__cxx11::string>
                          (&(psVar10->super_basic_symbol<yy::parser::by_state>).value);
      rpn::RPNExpression::Push<rpn::StringExpression,std::__cxx11::string>(&pPVar5->rpnExpr,pbVar13)
      ;
      break;
    case 0x29:
      puVar12 = value_type::as<unsigned_long>
                          ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8);
      *puVar12 = 1;
      break;
    case 0x2a:
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::operator[](&this->yystack_,1);
      puVar12 = value_type::as<unsigned_long>
                          (&(psVar10->super_basic_symbol<yy::parser::by_state>).value);
      uVar4 = *puVar12;
      puVar12 = value_type::as<unsigned_long>
                          ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8);
      *puVar12 = uVar4 + 1;
      break;
    case 0x2b:
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::operator[](&this->yystack_,1);
      puVar12 = value_type::as<unsigned_long>
                          (&(psVar10->super_basic_symbol<yy::parser::by_state>).value);
      uVar4 = *puVar12;
      puVar12 = value_type::as<unsigned_long>
                          ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8);
      *puVar12 = uVar4 + 1;
      break;
    case 0x2c:
      pPVar5 = this->ctx;
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::operator[](&this->yystack_,0);
      pbVar13 = value_type::as<std::__cxx11::string>
                          (&(psVar10->super_basic_symbol<yy::parser::by_state>).value);
      rpn::RPNExpression::Push<rpn::StringExpression,std::__cxx11::string>(&pPVar5->rpnExpr,pbVar13)
      ;
      break;
    case 0x2e:
      puVar12 = value_type::as<unsigned_long>
                          ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8);
      *puVar12 = 1;
      rpn::RPNExpression::Push<rpn::StringExpression,char_const(&)[1]>
                (&this->ctx->rpnExpr,(char (*) [1])0x11d01e);
      break;
    case 0x2f:
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::operator[](&this->yystack_,1);
      puVar12 = value_type::as<unsigned_long>
                          (&(psVar10->super_basic_symbol<yy::parser::by_state>).value);
      uVar4 = *puVar12;
      puVar12 = value_type::as<unsigned_long>
                          ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8);
      *puVar12 = uVar4;
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::operator[](&this->yystack_,2);
      pRVar11 = value_type::as<ReferenceType>
                          (&(psVar10->super_basic_symbol<yy::parser::by_state>).value);
      RVar2 = *pRVar11;
      if (RVar2 == Normal) {
        pPVar5 = this->ctx;
        puVar12 = value_type::as<unsigned_long>
                            ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8
                            );
        rpn::RPNExpression::Push<rpn::NormalVarRefExpression,unsigned_long&>
                  (&pPVar5->rpnExpr,puVar12);
      }
      else if (RVar2 == Cache) {
        pPVar5 = this->ctx;
        puVar12 = value_type::as<unsigned_long>
                            ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8
                            );
        rpn::RPNExpression::Push<rpn::CacheVarRefExpression,unsigned_long&>
                  (&pPVar5->rpnExpr,puVar12);
      }
      else if (RVar2 == Env) {
        pPVar5 = this->ctx;
        puVar12 = value_type::as<unsigned_long>
                            ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8
                            );
        rpn::RPNExpression::Push<rpn::EnvVarRefExpression,unsigned_long&>(&pPVar5->rpnExpr,puVar12);
      }
      break;
    case 0x30:
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::operator[](&this->yystack_,2);
      pRVar11 = value_type::as<ReferenceType>
                          (&(psVar10->super_basic_symbol<yy::parser::by_state>).value);
      if (*pRVar11 == Normal) {
        puVar12 = value_type::as<unsigned_long>
                            ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8
                            );
        *puVar12 = 1;
        rpn::RPNExpression::Push<rpn::FunctionRefExpression>(&this->ctx->rpnExpr);
        break;
      }
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::operator[](&this->yystack_,2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_2f0,"Only normal reference opening(${...}) is allowed for command reference",
                 (allocator<char> *)((long)&yyexc_1 + 7));
      (*this->_vptr_parser[3])
                (this,&(psVar10->super_basic_symbol<yy::parser::by_state>).location,local_2f0);
      std::__cxx11::string::~string(local_2f0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&yyexc_1 + 7));
      yylhs.super_basic_symbol<yy::parser::by_state>.location.end.column = 0x13;
      goto LAB_00109801;
    case 0x31:
      puVar12 = value_type::as<unsigned_long>
                          ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8);
      *puVar12 = 1;
      break;
    case 0x32:
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::operator[](&this->yystack_,1);
      puVar12 = value_type::as<unsigned_long>
                          (&(psVar10->super_basic_symbol<yy::parser::by_state>).value);
      uVar4 = *puVar12;
      puVar12 = value_type::as<unsigned_long>
                          ((value_type *)&yylhs.super_basic_symbol<yy::parser::by_state>.field_0x8);
      *puVar12 = uVar4 + 1;
      break;
    case 0x33:
      pPVar5 = this->ctx;
      psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                ::operator[](&this->yystack_,0);
      pbVar13 = value_type::as<std::__cxx11::string>
                          (&(psVar10->super_basic_symbol<yy::parser::by_state>).value);
      rpn::RPNExpression::Push<rpn::StringExpression,std::__cxx11::string>(&pPVar5->rpnExpr,pbVar13)
      ;
    }
    if (this->yydebug_ != 0) {
      poVar9 = std::operator<<(this->yycdebug_,"-> $$ =");
      std::operator<<(poVar9,' ');
      yy_print_<yy::parser::by_state>
                (this,this->yycdebug_,(basic_symbol<yy::parser::by_state> *)&range.range_);
      std::operator<<(this->yycdebug_,'\n');
    }
    yypop_(this,yyerrstatus_);
    yyerrstatus_ = 0;
    yypush_(this,(char *)0x0,(stack_symbol_type *)&range.range_);
    yylhs.super_basic_symbol<yy::parser::by_state>.location.end.column = 0;
LAB_00109801:
    stack_symbol_type::~stack_symbol_type((stack_symbol_type *)&range.range_);
    if (yylhs.super_basic_symbol<yy::parser::by_state>.location.end.column == 0) goto LAB_0010828b;
    if (yylhs.super_basic_symbol<yy::parser::by_state>.location.end.column != 0x13)
    goto LAB_00109dbb;
    yypop_(this,yyerrstatus_);
    yyerrstatus_ = 0;
    if (this->yydebug_ != 0) {
      (*this->_vptr_parser[6])();
    }
  }
  else {
    bVar6 = basic_symbol<yy::parser::by_kind>::empty
                      ((basic_symbol<yy::parser::by_kind> *)
                       &yyerror_range[2].super_basic_symbol<yy::parser::by_state>.location.end.line)
    ;
    if (bVar6) {
      if (this->yydebug_ != 0) {
        std::operator<<(this->yycdebug_,"Reading a token\n");
      }
      yylex((symbol_type *)&yyexc,this->yyscanner);
      basic_symbol<yy::parser::by_kind>::move
                ((basic_symbol<yy::parser::by_kind> *)
                 &yyerror_range[2].super_basic_symbol<yy::parser::by_state>.location.end.line,
                 (basic_symbol<yy::parser::by_kind> *)&yyexc);
      symbol_type::~symbol_type((symbol_type *)&yyexc);
    }
    if (this->yydebug_ != 0) {
      poVar9 = std::operator<<(this->yycdebug_,"Next token is");
      std::operator<<(poVar9,' ');
      yy_print_<yy::parser::by_kind>
                (this,this->yycdebug_,
                 (basic_symbol<yy::parser::by_kind> *)
                 &yyerror_range[2].super_basic_symbol<yy::parser::by_state>.location.end.line);
      std::operator<<(this->yycdebug_,'\n');
    }
    sVar7 = by_kind::kind((by_kind *)
                          &yyerror_range[2].super_basic_symbol<yy::parser::by_state>.location.end.
                           line);
    if (sVar7 == S_YYerror) {
      yyerror_range[2].super_basic_symbol<yy::parser::by_state>.location.end.line = 2;
      goto LAB_00109999;
    }
    sVar7 = by_kind::kind((by_kind *)
                          &yyerror_range[2].super_basic_symbol<yy::parser::by_state>.location.end.
                           line);
    iVar8 = sVar7 + cVar1;
    if (((-1 < iVar8) && (iVar8 < 0x51)) &&
       (cVar1 = yycheck_[iVar8],
       sVar7 = by_kind::kind((by_kind *)
                             &yyerror_range[2].super_basic_symbol<yy::parser::by_state>.location.end
                              .line), cVar1 == sVar7)) {
      yyvalue = (int)(char)yytable_[iVar8];
      if (yyvalue < 1) {
        bVar6 = yy_table_value_is_error_(yyvalue);
        if (!bVar6) {
          sVar7 = by_kind::kind((by_kind *)
                                &yyerror_range[2].super_basic_symbol<yy::parser::by_state>.location.
                                 end.line);
          bVar6 = yy_lac_establish_(this,sVar7);
          if (bVar6) {
            yynerrs_ = -yyvalue;
            goto LAB_00108743;
          }
        }
        goto LAB_00109849;
      }
      if (yyla.super_basic_symbol<yy::parser::by_kind>.location.end.line != 0) {
        yyla.super_basic_symbol<yy::parser::by_kind>.location.end.line =
             yyla.super_basic_symbol<yy::parser::by_kind>.location.end.line + -1;
      }
      yypush_(this,"Shifting",yytable_[iVar8],
              (symbol_type *)
              &yyerror_range[2].super_basic_symbol<yy::parser::by_state>.location.end.line);
      yy_lac_discard_(this,"shift");
      goto LAB_0010828b;
    }
    sVar7 = by_kind::kind((by_kind *)
                          &yyerror_range[2].super_basic_symbol<yy::parser::by_state>.location.end.
                           line);
    bVar6 = yy_lac_establish_(this,sVar7);
    if (bVar6) goto LAB_001086fe;
LAB_00109849:
    if (yyla.super_basic_symbol<yy::parser::by_kind>.location.end.line == 0) {
      yyla.super_basic_symbol<yy::parser::by_kind>.location.end.column =
           yyla.super_basic_symbol<yy::parser::by_kind>.location.end.column + 1;
      context::context((context *)((long)&msg.field_2 + 8),this,
                       (symbol_type *)
                       &yyerror_range[2].super_basic_symbol<yy::parser::by_state>.location.end.line)
      ;
      (*this->_vptr_parser[4])(local_330,this,(undefined1 *)((long)&msg.field_2 + 8));
      (*this->_vptr_parser[3])
                (this,&yyla.super_basic_symbol<yy::parser::by_kind>.value.field_0x28,local_330);
      std::__cxx11::string::~string(local_330);
    }
    yyerror_range[1].super_basic_symbol<yy::parser::by_state>.value._40_8_ =
         yyla.super_basic_symbol<yy::parser::by_kind>.value._40_8_;
    yyerror_range[1].super_basic_symbol<yy::parser::by_state>.location.begin.filename =
         yyla.super_basic_symbol<yy::parser::by_kind>.location.begin.filename;
    yyerror_range[1].super_basic_symbol<yy::parser::by_state>.location.begin.line =
         yyla.super_basic_symbol<yy::parser::by_kind>.location.begin.line;
    yyerror_range[1].super_basic_symbol<yy::parser::by_state>.location.begin.column =
         yyla.super_basic_symbol<yy::parser::by_kind>.location.begin.column;
    yyerror_range[1].super_basic_symbol<yy::parser::by_state>.location.end.filename =
         yyla.super_basic_symbol<yy::parser::by_kind>.location.end.filename;
    if (yyla.super_basic_symbol<yy::parser::by_kind>.location.end.line == 3) {
      sVar7 = by_kind::kind((by_kind *)
                            &yyerror_range[2].super_basic_symbol<yy::parser::by_state>.location.end.
                             line);
      if (sVar7 != S_YYEOF) {
        bVar6 = basic_symbol<yy::parser::by_kind>::empty
                          ((basic_symbol<yy::parser::by_kind> *)
                           &yyerror_range[2].super_basic_symbol<yy::parser::by_state>.location.end.
                            line);
        if (!bVar6) {
          yy_destroy_<yy::parser::by_kind>
                    (this,"Error: discarding",
                     (basic_symbol<yy::parser::by_kind> *)
                     &yyerror_range[2].super_basic_symbol<yy::parser::by_state>.location.end.line);
          basic_symbol<yy::parser::by_kind>::clear
                    ((basic_symbol<yy::parser::by_kind> *)
                     &yyerror_range[2].super_basic_symbol<yy::parser::by_state>.location.end.line);
        }
        goto LAB_00109999;
      }
LAB_00109c1d:
      yylookahead.super_basic_symbol<yy::parser::by_kind>.location.end.line = 1;
LAB_00109c27:
      bVar6 = basic_symbol<yy::parser::by_kind>::empty
                        ((basic_symbol<yy::parser::by_kind> *)
                         &yyerror_range[2].super_basic_symbol<yy::parser::by_state>.location.end.
                          line);
      if (!bVar6) {
        yy_destroy_<yy::parser::by_kind>
                  (this,"Cleanup: discarding lookahead",
                   (basic_symbol<yy::parser::by_kind> *)
                   &yyerror_range[2].super_basic_symbol<yy::parser::by_state>.location.end.line);
      }
      yypop_(this,yyerrstatus_);
      if (this->yydebug_ != 0) {
        (*this->_vptr_parser[6])();
      }
      while (iVar14 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                      ::size(&this->yystack_), 1 < iVar14) {
        pbVar15 = &stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,0)->super_basic_symbol<yy::parser::by_state>;
        yy_destroy_<yy::parser::by_state>(this,"Cleanup: popping",pbVar15);
        yypop_(this,1);
      }
      this_local._4_4_ = yylookahead.super_basic_symbol<yy::parser::by_kind>.location.end.line;
      yylhs.super_basic_symbol<yy::parser::by_state>.location.end.column = 1;
LAB_00109dbb:
      local_658 = &yyerror_range[2].super_basic_symbol<yy::parser::by_state>.location.end.line;
      do {
        local_658 = local_658 + -0x18;
        stack_symbol_type::~stack_symbol_type((stack_symbol_type *)local_658);
      } while (local_658 != (counter_type *)local_1a8);
      symbol_type::~symbol_type
                ((symbol_type *)
                 &yyerror_range[2].super_basic_symbol<yy::parser::by_state>.location.end.line);
      return this_local._4_4_;
    }
  }
LAB_00109999:
  yyla.super_basic_symbol<yy::parser::by_kind>.location.end.line = 3;
  while( true ) {
    psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
              ::operator[](&this->yystack_,0);
    cVar1 = yypact_[(int)(psVar10->super_basic_symbol<yy::parser::by_state>).super_by_state.state];
    bVar6 = yy_pact_value_is_default_((int)cVar1);
    if ((((!bVar6) && (iVar8 = cVar1 + 1, -1 < iVar8)) && (iVar8 < 0x51)) &&
       ((yycheck_[iVar8] == '\x01' && (cVar1 = yytable_[iVar8], '\0' < cVar1)))) break;
    iVar14 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
             ::size(&this->yystack_);
    if (iVar14 == 1) goto LAB_00109c1d;
    psVar10 = stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
              ::operator[](&this->yystack_,0);
    yyerror_range[1].super_basic_symbol<yy::parser::by_state>.value._40_8_ =
         (psVar10->super_basic_symbol<yy::parser::by_state>).location.begin.filename;
    yyerror_range[1].super_basic_symbol<yy::parser::by_state>.location.begin.filename =
         *(filename_type **)&(psVar10->super_basic_symbol<yy::parser::by_state>).location.begin.line
    ;
    yyerror_range[1].super_basic_symbol<yy::parser::by_state>.location.begin._8_8_ =
         (psVar10->super_basic_symbol<yy::parser::by_state>).location.end.filename;
    yyerror_range[1].super_basic_symbol<yy::parser::by_state>.location.end.filename =
         *(filename_type **)&(psVar10->super_basic_symbol<yy::parser::by_state>).location.end.line;
    pbVar15 = &stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
               ::operator[](&this->yystack_,0)->super_basic_symbol<yy::parser::by_state>;
    yy_destroy_<yy::parser::by_state>(this,"Error: popping",pbVar15);
    yypop_(this,1);
    if (this->yydebug_ != 0) {
      (*this->_vptr_parser[6])();
    }
  }
  stack_symbol_type::stack_symbol_type((stack_symbol_type *)local_398);
  yyerror_range[2].super_basic_symbol<yy::parser::by_state>.value._40_8_ =
       yyla.super_basic_symbol<yy::parser::by_kind>.value._40_8_;
  yyerror_range[2].super_basic_symbol<yy::parser::by_state>.location.begin.filename =
       yyla.super_basic_symbol<yy::parser::by_kind>.location.begin.filename;
  yyerror_range[2].super_basic_symbol<yy::parser::by_state>.location.begin.line =
       yyla.super_basic_symbol<yy::parser::by_kind>.location.begin.line;
  yyerror_range[2].super_basic_symbol<yy::parser::by_state>.location.begin.column =
       yyla.super_basic_symbol<yy::parser::by_kind>.location.begin.column;
  yyerror_range[2].super_basic_symbol<yy::parser::by_state>.location.end.filename =
       yyla.super_basic_symbol<yy::parser::by_kind>.location.end.filename;
  error_token.super_basic_symbol<yy::parser::by_state>.value._40_8_ =
       yyerror_range[1].super_basic_symbol<yy::parser::by_state>.value._40_8_;
  error_token.super_basic_symbol<yy::parser::by_state>.location.begin.filename =
       yyerror_range[1].super_basic_symbol<yy::parser::by_state>.location.begin.filename;
  error_token.super_basic_symbol<yy::parser::by_state>.location.begin.line =
       yyla.super_basic_symbol<yy::parser::by_kind>.location.begin.line;
  error_token.super_basic_symbol<yy::parser::by_state>.location.begin.column =
       yyla.super_basic_symbol<yy::parser::by_kind>.location.begin.column;
  error_token.super_basic_symbol<yy::parser::by_state>.location.end.filename =
       yyla.super_basic_symbol<yy::parser::by_kind>.location.end.filename;
  yy_lac_discard_(this,"error recovery");
  local_398[0] = cVar1;
  yypush_(this,"Shifting",(stack_symbol_type *)local_398);
  stack_symbol_type::~stack_symbol_type((stack_symbol_type *)local_398);
  goto LAB_0010828b;
}

Assistant:

int
  parser::parse ()
  {
    int yyn;
    /// Length of the RHS of the rule being reduced.
    int yylen = 0;

    // Error handling.
    int yynerrs_ = 0;
    int yyerrstatus_ = 0;

    /// The lookahead symbol.
    symbol_type yyla;

    /// The locations where the error started and ended.
    stack_symbol_type yyerror_range[3];

    /// The return value of parse ().
    int yyresult;

    // Discard the LAC context in case there still is one left from a
    // previous invocation.
    yy_lac_discard_ ("init");

#if YY_EXCEPTIONS
    try
#endif // YY_EXCEPTIONS
      {
    YYCDEBUG << "Starting parse\n";


    /* Initialize the stack.  The initial state will be set in
       yynewstate, since the latter expects the semantical and the
       location values to have been already stored, initialize these
       stacks with a primary value.  */
    yystack_.clear ();
    yypush_ (YY_NULLPTR, 0, YY_MOVE (yyla));

  /*-----------------------------------------------.
  | yynewstate -- push a new symbol on the stack.  |
  `-----------------------------------------------*/
  yynewstate:
    YYCDEBUG << "Entering state " << int (yystack_[0].state) << '\n';
    YY_STACK_PRINT ();

    // Accept?
    if (yystack_[0].state == yyfinal_)
      YYACCEPT;

    goto yybackup;


  /*-----------.
  | yybackup.  |
  `-----------*/
  yybackup:
    // Try to take a decision without lookahead.
    yyn = yypact_[+yystack_[0].state];
    if (yy_pact_value_is_default_ (yyn))
      goto yydefault;

    // Read a lookahead token.
    if (yyla.empty ())
      {
        YYCDEBUG << "Reading a token\n";
#if YY_EXCEPTIONS
        try
#endif // YY_EXCEPTIONS
          {
            symbol_type yylookahead (yylex (yyscanner));
            yyla.move (yylookahead);
          }
#if YY_EXCEPTIONS
        catch (const syntax_error& yyexc)
          {
            YYCDEBUG << "Caught exception: " << yyexc.what() << '\n';
            error (yyexc);
            goto yyerrlab1;
          }
#endif // YY_EXCEPTIONS
      }
    YY_SYMBOL_PRINT ("Next token is", yyla);

    if (yyla.kind () == symbol_kind::S_YYerror)
    {
      // The scanner already issued an error message, process directly
      // to error recovery.  But do not keep the error token as
      // lookahead, it is too special and may lead us to an endless
      // loop in error recovery. */
      yyla.kind_ = symbol_kind::S_YYUNDEF;
      goto yyerrlab1;
    }

    /* If the proper action on seeing token YYLA.TYPE is to reduce or
       to detect an error, take that action.  */
    yyn += yyla.kind ();
    if (yyn < 0 || yylast_ < yyn || yycheck_[yyn] != yyla.kind ())
      {
        if (!yy_lac_establish_ (yyla.kind ()))
          goto yyerrlab;
        goto yydefault;
      }

    // Reduce or error.
    yyn = yytable_[yyn];
    if (yyn <= 0)
      {
        if (yy_table_value_is_error_ (yyn))
          goto yyerrlab;
        if (!yy_lac_establish_ (yyla.kind ()))
          goto yyerrlab;

        yyn = -yyn;
        goto yyreduce;
      }

    // Count tokens shifted since error; after three, turn off error status.
    if (yyerrstatus_)
      --yyerrstatus_;

    // Shift the lookahead token.
    yypush_ ("Shifting", state_type (yyn), YY_MOVE (yyla));
    yy_lac_discard_ ("shift");
    goto yynewstate;


  /*-----------------------------------------------------------.
  | yydefault -- do the default action for the current state.  |
  `-----------------------------------------------------------*/
  yydefault:
    yyn = yydefact_[+yystack_[0].state];
    if (yyn == 0)
      goto yyerrlab;
    goto yyreduce;


  /*-----------------------------.
  | yyreduce -- do a reduction.  |
  `-----------------------------*/
  yyreduce:
    yylen = yyr2_[yyn];
    {
      stack_symbol_type yylhs;
      yylhs.state = yy_lr_goto_state_ (yystack_[yylen].state, yyr1_[yyn]);
      /* Variants are always initialized to an empty instance of the
         correct type. The default '$$ = $1' action is NOT applied
         when using variants.  */
      switch (yyr1_[yyn])
    {
      case symbol_kind::S_REF_OPEN: // "reference opening"
        yylhs.value.emplace< ReferenceType > ();
        break;

      case symbol_kind::S_arguments: // arguments
      case symbol_kind::S_argument_list: // argument_list
      case symbol_kind::S_parenthesized_arguments: // parenthesized_arguments
      case symbol_kind::S_quoted_argument: // quoted_argument
      case symbol_kind::S_quoted_element_list: // quoted_element_list
      case symbol_kind::S_unquoted_argument: // unquoted_argument
      case symbol_kind::S_reference: // reference
      case symbol_kind::S_var_reference_list: // var_reference_list
        yylhs.value.emplace< std::size_t > ();
        break;

      case symbol_kind::S_IDENTIFIER: // "command name"
      case symbol_kind::S_BRACKET_ARGUMENT: // "bracket argument"
      case symbol_kind::S_REF_VAR_NAME: // "variable name"
      case symbol_kind::S_QUOTED_STR: // "quoted argument chars"
      case symbol_kind::S_UNQUOTED_STR: // "unquoted argument chars"
        yylhs.value.emplace< std::string > ();
        break;

      default:
        break;
    }


      // Default location.
      {
        stack_type::slice range (yystack_, yylen);
        YYLLOC_DEFAULT (yylhs.location, range, yylen);
        yyerror_range[1].location = yylhs.location;
      }

      // Perform the reduction.
      YY_REDUCE_PRINT (yyn);
#if YY_EXCEPTIONS
      try
#endif // YY_EXCEPTIONS
        {
          switch (yyn)
            {
  case 2: // $@1: %empty
#line 127 "parser.y"
      {
        PushState(BOM, yyscanner);
    }
#line 684 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 3: // file: $@1 bom file_element_list
#line 129 "parser.y"
                            {
        PopState(yyscanner);
    }
#line 692 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 6: // bom: "non UTF-8 BOM"
#line 137 "parser.y"
              {
        error(yystack_[0].location, "only UTF-8 BOM is supported");
        YYERROR;
    }
#line 701 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 9: // file_element: space_list command_invocation space_list file_line_ending
#line 149 "parser.y"
                                                                {
        if(ctx.immediateEval)
        {
            ctx.rpnExpr.Evaluate();
            std::cout << '\n';
        }
        else
        {
            ctx.rpnExprList.push_back(std::move(ctx.rpnExpr));
        }
        ctx.rpnExpr.Clear();
    }
#line 718 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 15: // $@2: %empty
#line 175 "parser.y"
                 {
        ctx.rpnExpr.Push<StringExpression>(std::move(yystack_[0].value.as < std::string > ()));
    }
#line 726 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 16: // $@3: %empty
#line 177 "parser.y"
                            {
        PushState(ARGUMENTS, yyscanner);
    }
#line 734 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 17: // command_invocation: "command name" $@2 space_list "open paren" $@3 arguments "close paren"
#line 181 "parser.y"
                {
        ctx.rpnExpr.Push<CommandCallExpression>(yystack_[1].value.as < std::size_t > () + 1);

        PopState(yyscanner);
    }
#line 744 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 18: // arguments: zero_or_more_separation
#line 193 "parser.y"
                              {
        yylhs.value.as < std::size_t > () = 0;
    }
#line 752 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 19: // arguments: zero_or_more_separation argument_list zero_or_more_separation
#line 196 "parser.y"
                                                                    {
        yylhs.value.as < std::size_t > () = yystack_[1].value.as < std::size_t > ();
    }
#line 760 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 20: // argument_list: argument
#line 203 "parser.y"
               {
        yylhs.value.as < std::size_t > () = 1;
    }
#line 768 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 21: // argument_list: parenthesized_arguments
#line 206 "parser.y"
                              {
        yylhs.value.as < std::size_t > () = yystack_[0].value.as < std::size_t > ();
    }
#line 776 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 22: // argument_list: "bracket comment"
#line 209 "parser.y"
                      {
        yylhs.value.as < std::size_t > () = 0;
    }
#line 784 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 23: // argument_list: argument_list one_or_more_separation argument
#line 212 "parser.y"
                                                    {
        yylhs.value.as < std::size_t > () = yystack_[2].value.as < std::size_t > () + 1;
    }
#line 792 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 24: // argument_list: argument_list zero_or_more_separation "bracket comment"
#line 215 "parser.y"
                                                            {
        yylhs.value.as < std::size_t > () = yystack_[2].value.as < std::size_t > ();
    }
#line 800 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 25: // argument_list: argument_list zero_or_more_separation parenthesized_arguments
#line 218 "parser.y"
                                                                    {
        yylhs.value.as < std::size_t > () = yystack_[2].value.as < std::size_t > () + yystack_[0].value.as < std::size_t > ();
    }
#line 808 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 26: // $@4: %empty
#line 224 "parser.y"
                 {
        ctx.rpnExpr.Push<StringExpression>("(");
        ctx.rpnExpr.Push<UnquotedArgExpression>(1);
    }
#line 817 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 27: // parenthesized_arguments: "open paren" $@4 arguments "close paren"
#line 227 "parser.y"
                            {
        yylhs.value.as < std::size_t > () = yystack_[1].value.as < std::size_t > () + 1 + 1;
        ctx.rpnExpr.Push<StringExpression>(")");
        ctx.rpnExpr.Push<UnquotedArgExpression>(1);
    }
#line 827 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 32: // argument: "bracket argument"
#line 245 "parser.y"
                       {
        ctx.rpnExpr.Push<StringExpression>(std::move(yystack_[0].value.as < std::string > ()));
        ctx.rpnExpr.Push<BracketArgExpression>();
    }
#line 836 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 33: // argument: quoted_argument
#line 249 "parser.y"
                      {
        ctx.rpnExpr.Push<QuotedArgExpression>(yystack_[0].value.as < std::size_t > ());
    }
#line 844 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 34: // argument: unquoted_argument
#line 252 "parser.y"
                        {
        ctx.rpnExpr.Push<UnquotedArgExpression>(yystack_[0].value.as < std::size_t > ());
    }
#line 852 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 35: // quoted_argument: "double quote" "double quote"
#line 332 "parser.y"
                                {
        yylhs.value.as < std::size_t > () = 1;
        ctx.rpnExpr.Push<StringExpression>("");
    }
#line 861 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 36: // quoted_argument: "double quote" quoted_element_list "double quote"
#line 336 "parser.y"
                                                    {
        yylhs.value.as < std::size_t > () = yystack_[1].value.as < std::size_t > ();
    }
#line 869 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 37: // quoted_element_list: quoted_element
#line 342 "parser.y"
                     {
        yylhs.value.as < std::size_t > () = 1;
    }
#line 877 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 38: // quoted_element_list: quoted_element_list quoted_element
#line 345 "parser.y"
                                         {
        yylhs.value.as < std::size_t > () = yystack_[1].value.as < std::size_t > () + 1;
    }
#line 885 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 39: // quoted_element: "quoted argument chars"
#line 351 "parser.y"
                 {
        ctx.rpnExpr.Push<StringExpression>(std::move(yystack_[0].value.as < std::string > ()));
    }
#line 893 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 41: // unquoted_argument: unquoted_element
#line 358 "parser.y"
                       {
        yylhs.value.as < std::size_t > () = 1;
    }
#line 901 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 42: // unquoted_argument: unquoted_argument unquoted_element
#line 361 "parser.y"
                                         {
        yylhs.value.as < std::size_t > () = yystack_[1].value.as < std::size_t > () + 1;
    }
#line 909 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 43: // unquoted_argument: unquoted_argument quoted_argument
#line 364 "parser.y"
                                        {
        yylhs.value.as < std::size_t > () = yystack_[1].value.as < std::size_t > () + 1;
    }
#line 917 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 44: // unquoted_element: "unquoted argument chars"
#line 370 "parser.y"
                   {
        ctx.rpnExpr.Push<StringExpression>(std::move(yystack_[0].value.as < std::string > ()));
    }
#line 925 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 46: // reference: "reference opening" "reference closing"
#line 393 "parser.y"
                         {
        yylhs.value.as < std::size_t > () = 1;
        // empty reference always evaluates to empty string
        ctx.rpnExpr.Push<StringExpression>("");
    }
#line 935 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 47: // reference: "reference opening" var_reference_list "reference closing"
#line 398 "parser.y"
                                            {
        yylhs.value.as < std::size_t > () = yystack_[1].value.as < std::size_t > ();
        switch(yystack_[2].value.as < ReferenceType > ())
        {
        case ReferenceType::Normal:
            ctx.rpnExpr.Push<NormalVarRefExpression>(yylhs.value.as < std::size_t > ());
            break;
        case ReferenceType::Cache:
            ctx.rpnExpr.Push<CacheVarRefExpression>(yylhs.value.as < std::size_t > ());
            break;
        case ReferenceType::Env:
            ctx.rpnExpr.Push<EnvVarRefExpression>(yylhs.value.as < std::size_t > ());
            break;
        }
    }
#line 955 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 48: // reference: "reference opening" command_invocation "reference closing"
#line 413 "parser.y"
                                            {
        if(yystack_[2].value.as < ReferenceType > () != ReferenceType::Normal)
        {
            error(yystack_[2].location,
                "Only normal reference opening(${...}) "
                "is allowed for command reference");
            YYERROR;
        }
        yylhs.value.as < std::size_t > () = 1;
        ctx.rpnExpr.Push<FunctionRefExpression>();
    }
#line 971 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 49: // var_reference_list: var_reference_element
#line 427 "parser.y"
                            {
        yylhs.value.as < std::size_t > () = 1;
    }
#line 979 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 50: // var_reference_list: var_reference_list var_reference_element
#line 430 "parser.y"
                                               {
        yylhs.value.as < std::size_t > () = yystack_[1].value.as < std::size_t > () + 1;
    }
#line 987 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;

  case 51: // var_reference_element: "variable name"
#line 436 "parser.y"
                   {
        ctx.rpnExpr.Push<StringExpression>(std::move(yystack_[0].value.as < std::string > ()));
    }
#line 995 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"
    break;


#line 999 "/workspace/llm4binary/github/license_all_cmakelists_25/OleksandrKvl[P]cmake_parser/build_O0/src/parser.cpp"

            default:
              break;
            }
        }
#if YY_EXCEPTIONS
      catch (const syntax_error& yyexc)
        {
          YYCDEBUG << "Caught exception: " << yyexc.what() << '\n';
          error (yyexc);
          YYERROR;
        }
#endif // YY_EXCEPTIONS
      YY_SYMBOL_PRINT ("-> $$ =", yylhs);
      yypop_ (yylen);
      yylen = 0;

      // Shift the result of the reduction.
      yypush_ (YY_NULLPTR, YY_MOVE (yylhs));
    }
    goto yynewstate;


  /*--------------------------------------.
  | yyerrlab -- here on detecting error.  |
  `--------------------------------------*/
  yyerrlab:
    // If not already recovering from an error, report this error.
    if (!yyerrstatus_)
      {
        ++yynerrs_;
        context yyctx (*this, yyla);
        std::string msg = yysyntax_error_ (yyctx);
        error (yyla.location, YY_MOVE (msg));
      }


    yyerror_range[1].location = yyla.location;
    if (yyerrstatus_ == 3)
      {
        /* If just tried and failed to reuse lookahead token after an
           error, discard it.  */

        // Return failure if at end of input.
        if (yyla.kind () == symbol_kind::S_YYEOF)
          YYABORT;
        else if (!yyla.empty ())
          {
            yy_destroy_ ("Error: discarding", yyla);
            yyla.clear ();
          }
      }

    // Else will try to reuse lookahead token after shifting the error token.
    goto yyerrlab1;


  /*---------------------------------------------------.
  | yyerrorlab -- error raised explicitly by YYERROR.  |
  `---------------------------------------------------*/
  yyerrorlab:
    /* Pacify compilers when the user code never invokes YYERROR and
       the label yyerrorlab therefore never appears in user code.  */
    if (false)
      YYERROR;

    /* Do not reclaim the symbols of the rule whose action triggered
       this YYERROR.  */
    yypop_ (yylen);
    yylen = 0;
    YY_STACK_PRINT ();
    goto yyerrlab1;


  /*-------------------------------------------------------------.
  | yyerrlab1 -- common code for both syntax error and YYERROR.  |
  `-------------------------------------------------------------*/
  yyerrlab1:
    yyerrstatus_ = 3;   // Each real token shifted decrements this.
    // Pop stack until we find a state that shifts the error token.
    for (;;)
      {
        yyn = yypact_[+yystack_[0].state];
        if (!yy_pact_value_is_default_ (yyn))
          {
            yyn += symbol_kind::S_YYerror;
            if (0 <= yyn && yyn <= yylast_
                && yycheck_[yyn] == symbol_kind::S_YYerror)
              {
                yyn = yytable_[yyn];
                if (0 < yyn)
                  break;
              }
          }

        // Pop the current state because it cannot handle the error token.
        if (yystack_.size () == 1)
          YYABORT;

        yyerror_range[1].location = yystack_[0].location;
        yy_destroy_ ("Error: popping", yystack_[0]);
        yypop_ ();
        YY_STACK_PRINT ();
      }
    {
      stack_symbol_type error_token;

      yyerror_range[2].location = yyla.location;
      YYLLOC_DEFAULT (error_token.location, yyerror_range, 2);

      // Shift the error token.
      yy_lac_discard_ ("error recovery");
      error_token.state = state_type (yyn);
      yypush_ ("Shifting", YY_MOVE (error_token));
    }
    goto yynewstate;


  /*-------------------------------------.
  | yyacceptlab -- YYACCEPT comes here.  |
  `-------------------------------------*/
  yyacceptlab:
    yyresult = 0;
    goto yyreturn;


  /*-----------------------------------.
  | yyabortlab -- YYABORT comes here.  |
  `-----------------------------------*/
  yyabortlab:
    yyresult = 1;
    goto yyreturn;


  /*-----------------------------------------------------.
  | yyreturn -- parsing is finished, return the result.  |
  `-----------------------------------------------------*/
  yyreturn:
    if (!yyla.empty ())
      yy_destroy_ ("Cleanup: discarding lookahead", yyla);

    /* Do not reclaim the symbols of the rule whose action triggered
       this YYABORT or YYACCEPT.  */
    yypop_ (yylen);
    YY_STACK_PRINT ();
    while (1 < yystack_.size ())
      {
        yy_destroy_ ("Cleanup: popping", yystack_[0]);
        yypop_ ();
      }

    return yyresult;
  }
#if YY_EXCEPTIONS
    catch (...)
      {
        YYCDEBUG << "Exception caught: cleaning lookahead and stack\n";
        // Do not try to display the values of the reclaimed symbols,
        // as their printers might throw an exception.
        if (!yyla.empty ())
          yy_destroy_ (YY_NULLPTR, yyla);

        while (1 < yystack_.size ())
          {
            yy_destroy_ (YY_NULLPTR, yystack_[0]);
            yypop_ ();
          }
        throw;
      }
#endif // YY_EXCEPTIONS
  }